

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void kurtosis_double_suite::test_left_skew(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  double absolute_tolerance;
  double *in_stack_fffffffffffffd68;
  double local_288;
  value_type local_280;
  value_type local_278;
  double local_268;
  value_type local_260;
  value_type local_258;
  double local_248;
  value_type local_240;
  value_type local_238;
  double local_228;
  value_type local_220;
  value_type local_218;
  double local_208;
  value_type local_200;
  value_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  value_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  value_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  value_type local_198;
  double local_188;
  value_type local_180;
  value_type local_178;
  double local_168;
  value_type local_160;
  value_type local_158;
  double local_148;
  value_type local_140;
  value_type local_138;
  double local_128;
  value_type local_120;
  value_type local_118;
  double local_108;
  value_type local_100;
  value_type local_f8;
  double local_e8;
  value_type local_e0;
  value_type local_d8;
  double local_c8;
  value_type local_c0 [4];
  undefined8 local_a0;
  value_type local_98 [2];
  undefined8 local_88;
  value_type local_80 [2];
  undefined8 local_70;
  value_type local_68 [2];
  undefined8 local_58;
  value_type local_50 [2];
  undefined1 local_40 [8];
  moment_kurtosis<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::basic_moment
            ((basic_moment<double,_(trial::online::with)4> *)local_40);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,1.0);
  local_50[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_58 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x282,"void kurtosis_double_suite::test_left_skew()",local_50,&local_58);
  local_68[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x283,"void kurtosis_double_suite::test_left_skew()",local_68,&local_70);
  local_80[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_88 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x284,"void kurtosis_double_suite::test_left_skew()",local_80,&local_88);
  local_98[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                          ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_a0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x285,"void kurtosis_double_suite::test_left_skew()",local_98,&local_a0);
  local_c0[2] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
                unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_c0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x286,"void kurtosis_double_suite::test_left_skew()",local_c0 + 2,local_c0 + 1);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,2.0);
  local_c0[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_c8 = 1.5;
  local_d8 = filter.sum.kurtosis;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x288,0x113c98,(char *)local_c0,&local_c8,in_stack_fffffffffffffd68,
             predicate_13);
  local_e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_e8 = 0.25;
  local_f8 = filter.sum.kurtosis;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x289,0x113c98,(char *)&local_e0,&local_e8,in_stack_fffffffffffffd68,
             predicate_12);
  local_100 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_108 = 0.0;
  local_118 = filter.sum.kurtosis;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x28a,0x113c98,(char *)&local_100,&local_108,in_stack_fffffffffffffd68,
             predicate_11);
  local_120 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_128 = 1.0;
  local_138 = filter.sum.kurtosis;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x28b,0x113c98,(char *)&local_120,&local_128,in_stack_fffffffffffffd68,
             predicate_10);
  local_140 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_148 = 0.0;
  local_158 = filter.sum.kurtosis;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x28c,0x113c98,(char *)&local_140,&local_148,in_stack_fffffffffffffd68,
             predicate_09);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,5.0);
  local_160 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_168 = 2.66667;
  local_178 = filter.sum.kurtosis;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.66667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x28e,0x113c98,(char *)&local_160,&local_168,in_stack_fffffffffffffd68,
             predicate_08);
  local_180 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_188 = 2.88889;
  local_198 = filter.sum.kurtosis;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.88889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x28f,0x113c98,(char *)&local_180,&local_188,in_stack_fffffffffffffd68,
             predicate_07);
  local_1a0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_1a8 = 0.528;
  local_1b8 = filter.sum.kurtosis;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.52800","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x290,0x113c98,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffffd68,
             predicate_06);
  local_1c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_1c8 = 1.5;
  local_1d8 = filter.sum.kurtosis;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x291,0x113c98,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffffd68,
             predicate_05);
  local_1e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_1e8 = 0.0;
  local_1f8 = filter.sum.kurtosis;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x292,0x113c98,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffffd68,
             predicate_04);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,15.0);
  local_200 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_208 = 5.75;
  local_218 = filter.sum.kurtosis;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x294,0x113c98,(char *)&local_200,&local_208,in_stack_fffffffffffffd68,
             predicate_03);
  local_220 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_228 = 30.6875;
  local_238 = filter.sum.kurtosis;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","30.6875","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x295,0x113c98,(char *)&local_220,&local_228,in_stack_fffffffffffffd68,
             predicate_02);
  local_240 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_248 = 0.92814;
  local_258 = filter.sum.kurtosis;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.92814","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x296,0x113c98,(char *)&local_240,&local_248,in_stack_fffffffffffffd68,
             predicate_01);
  local_260 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_268 = 2.13122;
  local_278 = filter.sum.kurtosis;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","2.13122","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x297,0x113c98,(char *)&local_260,&local_268,in_stack_fffffffffffffd68,
             predicate_00);
  local_280 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_288 = 5.48416;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","5.48416","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x298,0x113c98,(char *)&local_280,&local_288,(double *)filter.sum.kurtosis,
             predicate);
  return;
}

Assistant:

void test_left_skew()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::moment_kurtosis<double> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_kurtosis(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.5, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.25, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 0.0, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 2.66667, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.88889, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.52800, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.5, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 0.0, tolerance);
    filter.push(15.0);
    TRIAL_TEST_WITH(filter.mean(), 5.75, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 30.6875, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.92814, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 2.13122, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 5.48416, tolerance);
}